

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O3

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_node_edges(DG2Dot<dg::LLVMNode> *this,LLVMNode *n,int ind)

{
  ofstream *poVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  
  poVar1 = &this->out;
  iVar6 = ind;
  if (0 < ind) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* -- node ",0xb);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  iVar6 = ind;
  if (0 < ind) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," * ------------------------------------------- */\n",0x32);
  if ((this->options & 4) != 0) {
    iVar6 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* DD edges */\n",0xf);
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           dataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl
                           .super__Rb_tree_header + 0x10);
        p_Var5 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   dataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar6 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> NODE",8);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [color=\"",9);
      pcVar2 = this->dd_color;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" rank=max]\n",0xc);
    }
  }
  if ((this->options & 8) != 0) {
    iVar6 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"/* reverse DD edges */\n",0x17);
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           revDataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                           _M_impl.super__Rb_tree_header + 0x10);
        p_Var5 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   revDataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar6 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> NODE",8);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [color=\"",9);
      pcVar2 = this->dd_color;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" style=\"dashed\"  constraint=false]\n",0x24);
    }
  }
  if ((this->options & 0x10) != 0) {
    iVar6 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* USE edges */\n",0x10);
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           useEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                           super__Rb_tree_header + 0x10);
        p_Var5 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).useEdges.
                   super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar6 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> NODE",8);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [color=\"",9);
      pcVar2 = this->use_color;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" rank=max style=\"dashed\"]\n",0x1b);
    }
  }
  if ((this->options & 0x20) != 0) {
    iVar6 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* user edges */\n",0x11);
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           userEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                           super__Rb_tree_header + 0x10);
        p_Var5 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).userEdges.
                   super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar6 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> NODE",8);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [color=\"",9);
      pcVar2 = this->use_color;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" style=\"dashed\"  constraint=false]\n",0x24);
    }
  }
  if ((this->options & 0x40) != 0) {
    iVar6 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* CD edges */\n",0xf);
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           controlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                           _M_impl.super__Rb_tree_header + 0x10);
        p_Var5 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   controlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar6 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> NODE",8);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [color=\"",9);
      pcVar2 = this->cd_color;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"]\n",3);
    }
  }
  if ((this->options & 0x80) != 0) {
    iVar6 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"/* reverse CD edges */\n",0x17);
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           revControlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                           _M_impl.super__Rb_tree_header + 0x10);
        p_Var5 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   revControlDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                   super__Rb_tree_header._M_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar6 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> NODE",8);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [color=\"",9);
      pcVar2 = this->cd_color;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" style=\"dashed\" constraint=false]\n",0x23);
    }
  }
  if ((this->options & 0x100) != 0) {
    iVar6 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* ID edges */\n",0xf);
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           interferenceDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t
                           ._M_impl.super__Rb_tree_header + 0x10);
        p_Var5 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   interferenceDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl
                   .super__Rb_tree_header._M_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar6 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> NODE",8);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," [color=\"red\" constraint=false]\n",0x20);
    }
  }
  if ((this->options & 0x200) != 0) {
    iVar6 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"/* reverse ID edges */\n",0x17);
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                           revInterferenceDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container.
                           _M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var5 != &(n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   revInterferenceDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t.
                   _M_impl.super__Rb_tree_header._M_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar6 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> NODE",8);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," [color=\"orange\" constraint=false]\n",0x23);
    }
  }
  return;
}

Assistant:

void dump_node_edges(NodeT *n, int ind = 1) {
        Indent Ind(ind);

        out << Ind << "/* -- node " << n->getKey() << "\n"
            << Ind << " * ------------------------------------------- */\n";

        if (options & PRINT_DD) {
            out << Ind << "/* DD edges */\n";
            for (auto II = n->data_begin(), EE = n->data_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << dd_color << "\" rank=max]\n";
        }

        if (options & PRINT_REV_DD) {
            out << Ind << "/* reverse DD edges */\n";
            for (auto II = n->rev_data_begin(), EE = n->rev_data_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << dd_color << "\" style=\"dashed\"  constraint=false]\n";
        }

        if (options & PRINT_USE) {
            out << Ind << "/* USE edges */\n";
            for (auto II = n->use_begin(), EE = n->use_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << use_color << "\" rank=max style=\"dashed\"]\n";
        }

        if (options & PRINT_USER) {
            out << Ind << "/* user edges */\n";
            for (auto II = n->user_begin(), EE = n->user_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << use_color << "\" style=\"dashed\"  constraint=false]\n";
        }

        if (options & PRINT_CD) {
            out << Ind << "/* CD edges */\n";
            for (auto II = n->control_begin(), EE = n->control_end(); II != EE;
                 ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << cd_color << "\"]\n";
        }

        if (options & PRINT_REV_CD) {
            out << Ind << "/* reverse CD edges */\n";
            for (auto II = n->rev_control_begin(), EE = n->rev_control_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << cd_color << "\" style=\"dashed\" constraint=false]\n";
        }

        if (options & PRINT_ID) {
            out << Ind << "/* ID edges */\n";
            for (auto II = n->interference_begin(), EE = n->interference_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II
                    << " [color=\"red\" constraint=false]\n";
        }

        if (options & PRINT_REV_ID) {
            out << Ind << "/* reverse ID edges */\n";
            for (auto II = n->rev_interference_begin(),
                      EE = n->rev_interference_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II
                    << " [color=\"orange\" constraint=false]\n";
        }
    }